

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::InstrumentPass::GetUint8Id(InstrumentPass *this)

{
  uint32_t uVar1;
  IRContext *this_00;
  Type *type;
  Type *reg_uint8_ty;
  Integer uint8_ty;
  TypeManager *type_mgr;
  InstrumentPass *this_local;
  
  if (this->uint8_id_ == 0) {
    this_00 = Pass::context(&this->super_Pass);
    uint8_ty._40_8_ = IRContext::get_type_mgr(this_00);
    analysis::Integer::Integer((Integer *)&reg_uint8_ty,8,false);
    type = analysis::TypeManager::GetRegisteredType
                     ((TypeManager *)uint8_ty._40_8_,(Type *)&reg_uint8_ty);
    uVar1 = analysis::TypeManager::GetTypeInstruction((TypeManager *)uint8_ty._40_8_,type);
    this->uint8_id_ = uVar1;
    analysis::Integer::~Integer((Integer *)&reg_uint8_ty);
  }
  return this->uint8_id_;
}

Assistant:

uint32_t InstrumentPass::GetUint8Id() {
  if (uint8_id_ == 0) {
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Integer uint8_ty(8, false);
    analysis::Type* reg_uint8_ty = type_mgr->GetRegisteredType(&uint8_ty);
    uint8_id_ = type_mgr->GetTypeInstruction(reg_uint8_ty);
  }
  return uint8_id_;
}